

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConditionalStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConditionalStatement,std::span<slang::ast::ConditionalStatement::Condition,18446744073709551615ul>,slang::ast::UniquePriorityCheck,slang::ast::Statement_const&,slang::ast::Statement_const*&,slang::SourceRange>
          (BumpAllocator *this,
          span<slang::ast::ConditionalStatement::Condition,_18446744073709551615UL> *args,
          UniquePriorityCheck *args_1,Statement *args_2,Statement **args_3,SourceRange *args_4)

{
  span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL> conditions;
  SourceRange sourceRange;
  ConditionalStatement *ifFalse;
  SourceLocation in_RCX;
  SourceLocation in_RDX;
  __extent_storage<18446744073709551615UL> in_R9;
  size_t in_stack_ffffffffffffffa8;
  span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>
  *in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  ConditionalStatement *in_stack_ffffffffffffffc0;
  pointer in_stack_ffffffffffffffc8;
  
  ifFalse = (ConditionalStatement *)
            allocate(in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa8);
  std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>::
  span<slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>
            (in_stack_ffffffffffffffb0,
             (span<slang::ast::ConditionalStatement::Condition,_18446744073709551615UL> *)ifFalse);
  conditions._M_extent._M_extent_value = in_R9._M_extent_value;
  conditions._M_ptr = in_stack_ffffffffffffffc8;
  sourceRange.endLoc = in_RDX;
  sourceRange.startLoc = in_RCX;
  slang::ast::ConditionalStatement::ConditionalStatement
            (in_stack_ffffffffffffffc0,conditions,
             (UniquePriorityCheck)((ulong)*(undefined8 *)(in_R9._M_extent_value + 8) >> 0x20),
             *(Statement **)in_R9._M_extent_value,&ifFalse->super_Statement,sourceRange);
  return ifFalse;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }